

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<const_kj::WritableFileMapping> __thiscall
kj::anon_unknown_8::DiskFile::mmapWritable(DiskFile *this,uint64_t offset,uint64_t size)

{
  void *pvVar1;
  AutoCloseFd AVar2;
  uint64_t in_RCX;
  WritableFileMapping *extraout_RDX;
  MmapRange MVar3;
  Own<const_kj::WritableFileMapping> OVar4;
  Fault f;
  Fault local_30;
  
  MVar3 = getMmapRange(size,in_RCX);
  pvVar1 = ::mmap((void *)0x0,MVar3.size,3,1,*(int *)(offset + 8),MVar3.offset);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    __errno_location();
    local_30.exception = (Exception *)0x0;
    _::Debug::Fault::init
              (&local_30,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal(&local_30);
  }
  AVar2 = (AutoCloseFd)operator_new(0x20);
  *(undefined ***)AVar2 = &PTR_get_0046c4e8;
  *(uint64_t *)((long)AVar2 + 8) = (long)pvVar1 + (size - MVar3.offset);
  *(uint64_t *)((long)AVar2 + 0x10) = in_RCX;
  *(undefined8 **)((long)AVar2 + 0x18) = &(anonymous_namespace)::mmapDisposer;
  (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
       (_func_int **)
       &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::instance;
  (this->super_DiskHandle).fd = AVar2;
  OVar4.ptr = extraout_RDX;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    return DiskHandle::mmapWritable(offset, size);
  }